

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O2

void gen_exception_insn(DisasContext_conflict1 *s,uint64_t pc,int excp,uint32_t syndrome,
                       uint32_t target_el)

{
  TCGContext_conflict1 *tcg_ctx;
  
  tcg_ctx = s->uc->tcg_ctx;
  gen_a64_set_pc_im_aarch64(tcg_ctx,pc);
  gen_exception(tcg_ctx,excp,syndrome,target_el);
  (s->base).is_jmp = DISAS_NORETURN;
  return;
}

Assistant:

static void gen_exception_insn(DisasContext *s, uint64_t pc, int excp,
                               uint32_t syndrome, uint32_t target_el)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    gen_a64_set_pc_im(tcg_ctx, pc);
    gen_exception(tcg_ctx, excp, syndrome, target_el);
    s->base.is_jmp = DISAS_NORETURN;
}